

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_common.c
# Opt level: O0

EGLDisplay get_egl_display_or_skip(void)

{
  int iVar1;
  EGLDisplay pvVar2;
  _Bool ok;
  EGLDisplay edpy;
  EGLint minor;
  EGLint major;
  Display *dpy;
  
  _minor = XOpenDisplay(0);
  if (_minor == 0) {
    errx(0x4d,"couldn\'t open display\n");
  }
  pvVar2 = (EGLDisplay)(*_epoxy_eglGetDisplay)(_minor);
  if (pvVar2 == (EGLDisplay)0x0) {
    errx(1,"Couldn\'t get EGL display for X11 Display.\n");
  }
  iVar1 = (*_epoxy_eglInitialize)(pvVar2,(long)&edpy + 4,&edpy);
  if (iVar1 == 0) {
    errx(1,"eglInitialize() failed\n");
  }
  return pvVar2;
}

Assistant:

EGLDisplay 
get_egl_display_or_skip(void)
{
    Display *dpy = XOpenDisplay(NULL);
    EGLint major, minor;
    EGLDisplay edpy;
    bool ok;

    if (!dpy)
        errx(77, "couldn't open display\n");
    edpy = eglGetDisplay((EGLNativeDisplayType)dpy);
    if (edpy == EGL_NO_DISPLAY)
        errx(1, "Couldn't get EGL display for X11 Display.\n");

    ok = eglInitialize(edpy, &major, &minor);
    if (!ok)
        errx(1, "eglInitialize() failed\n");

    return edpy;
}